

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector_t * load_config(QString *file_name)

{
  byte bVar1;
  QString *in_RSI;
  tag_vector_t<cfgfile::qstring_trait_t> *in_RDI;
  exception_t<cfgfile::qstring_trait_t> *anon_var_0;
  QTextStream stream;
  QFile file;
  tag_vector_t<cfgfile::qstring_trait_t> read_tag;
  undefined7 in_stack_fffffffffffffea8;
  tag_vector_t<cfgfile::qstring_trait_t> *this;
  QTextStream local_120 [20];
  undefined4 local_10c;
  QFlags<QIODeviceBase::OpenModeFlag> local_108 [4];
  QFile local_f8 [72];
  tag_vector_t<cfgfile::qstring_trait_t> *in_stack_ffffffffffffff50;
  tag_vector_t<cfgfile::qstring_trait_t> *this_00;
  
  this = in_RDI;
  this_00 = in_RDI;
  cfg::tag_vector_t<cfgfile::qstring_trait_t>::tag_vector_t(in_stack_ffffffffffffff50);
  QFile::QFile(local_f8,in_RSI);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags(local_108,ReadOnly);
  bVar1 = QFile::open((QFlags *)local_f8);
  if ((bVar1 & 1) == 0) {
    cfg::vector_t::vector_t((vector_t *)0x114339);
    local_10c = 1;
  }
  else {
    QTextStream::QTextStream(local_120,(QIODevice *)local_f8);
    cfgfile::qstring_wrapper_t::qstring_wrapper_t
              ((qstring_wrapper_t *)this,(QString *)CONCAT17(bVar1,in_stack_fffffffffffffea8));
    cfgfile::read_cfgfile<cfgfile::qstring_trait_t>
              ((tag_t<cfgfile::qstring_trait_t> *)
               read_tag.m_vector.m_current.
               super___shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi,
               (istream_t *)
               read_tag.m_vector.m_current.
               super___shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(string_t *)
                       read_tag.m_vector.m_tags.
                       super__Vector_base<std::shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cfgfile::qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x1143b3);
    QFileDevice::close();
    cfg::tag_vector_t<cfgfile::qstring_trait_t>::get_cfg(this_00);
    local_10c = 1;
    QTextStream::~QTextStream(local_120);
  }
  QFile::~QFile(local_f8);
  cfg::tag_vector_t<cfgfile::qstring_trait_t>::~tag_vector_t(this);
  return (vector_t *)in_RDI;
}

Assistant:

cfg::vector_t load_config( const QString & file_name )
{
	cfg::tag_vector_t< cfgfile::qstring_trait_t > read_tag;

	QFile file( file_name );

	if( !file.open( QIODevice::ReadOnly ) )
		return cfg::vector_t();

	QTextStream stream( &file );

	try {
		cfgfile::read_cfgfile(
			read_tag, stream, file_name );

		file.close();
	}
	catch( const cfgfile::exception_t< cfgfile::qstring_trait_t > & )
	{
		file.close();

		throw;
	}

	return read_tag.get_cfg();
}